

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

void __thiscall FIX::SocketAcceptor::~SocketAcceptor(SocketAcceptor *this)

{
  _Base_ptr p_Var1;
  
  (this->super_Acceptor)._vptr_Acceptor = (_func_int **)&PTR__SocketAcceptor_001fe390;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketAcceptor_001fe408;
  for (p_Var1 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::~_Rb_tree(&(this->m_connections)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_unsigned_short>,_std::_Select1st<std::pair<const_FIX::SessionID,_unsigned_short>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_unsigned_short>_>_>
  ::~_Rb_tree(&(this->m_sessionToPort)._M_t);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
  ::~_Rb_tree(&(this->m_portToSessions)._M_t);
  Acceptor::~Acceptor(&this->super_Acceptor);
  return;
}

Assistant:

SocketAcceptor::~SocketAcceptor() {
  SocketConnections::iterator iter;
  for (iter = m_connections.begin(); iter != m_connections.end(); ++iter) {
    delete iter->second;
  }
}